

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

int __thiscall QMetaObjectBuilder::addRelatedMetaObject(QMetaObjectBuilder *this,QMetaObject *meta)

{
  qsizetype qVar1;
  long in_RDI;
  int index;
  parameter_type in_stack_ffffffffffffffd8;
  
  qVar1 = QList<const_QMetaObject_*>::size
                    ((QList<const_QMetaObject_*> *)(*(long *)(in_RDI + 8) + 0xb8));
  QList<const_QMetaObject_*>::append
            ((QList<const_QMetaObject_*> *)0x373a5d,in_stack_ffffffffffffffd8);
  return (int)qVar1;
}

Assistant:

int QMetaObjectBuilder::addRelatedMetaObject(const QMetaObject *meta)
{
    Q_ASSERT(meta);
    int index = d->relatedMetaObjects.size();
    d->relatedMetaObjects.append(meta);
    return index;
}